

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_active_uniformsiv(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint32 dVar2;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *pMVar3;
  size_type sVar4;
  reference uniformIndices;
  reference params;
  GLenum error;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<int> local_499;
  undefined1 local_498 [8];
  vector<int,_std::allocator<int>_> dummyParamsDst;
  value_type_conflict2 local_478 [2];
  undefined1 local_470 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidUniformIndices;
  int excess;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  MessageBuilder local_3e0;
  GLint local_260 [2];
  GLint numActiveUniforms;
  GLint dummyParamDst;
  GLuint dummyUniformIndex;
  string local_230;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs._4_4_ =
       glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,puVar1,&local_1f9);
  getVtxFragVersionSources(&local_1d8,&local_1f8,ctx);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dummyUniformIndex,puVar1,(allocator<char> *)((long)&dummyParamDst + 3));
  getVtxFragVersionSources(&local_230,(string *)&dummyUniformIndex,ctx);
  glu::makeVtxFragSources(&local_1b8,&local_1d8,&local_230);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&dummyUniformIndex);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dummyParamDst + 3));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  numActiveUniforms = 1;
  local_260[1] = 0xffffffff;
  local_260[0] = -1;
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar2);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,dVar2,0x8b86,local_260);
  this = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_3e0,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_3e0,(char (*) [25])"// GL_ACTIVE_UNIFORMS = ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_260);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" (expected 4).");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_401);
  NegativeTestContext::beginSection(ctx,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,0xffffffff,1,(GLuint *)&numActiveUniforms,0x8a37,
             local_260 + 1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_429);
  NegativeTestContext::beginSection(ctx,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_,1,
             (GLuint *)&numActiveUniforms,0x8a37,local_260 + 1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&excess,
             "GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program."
             ,(allocator<char> *)
              ((long)&invalidUniformIndices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  NegativeTestContext::beginSection(ctx,(string *)&excess);
  std::__cxx11::string::~string((string *)&excess);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&invalidUniformIndices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  for (invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage < 3;
      invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)invalidUniformIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
    local_478[1] = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,local_478 + 1);
    local_478[0] = local_260[0] + -1 +
                   (int)invalidUniformIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,local_478);
    dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,
               (value_type_conflict2 *)
               ((long)&dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
    std::allocator<int>::allocator(&local_499);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_498,sVar4,&local_499);
    std::allocator<int>::~allocator(&local_499);
    dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
    uniformIndices =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,0);
    params = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_498,0);
    glu::CallLogWrapper::glGetActiveUniformsiv
              (&ctx->super_CallLogWrapper,dVar2,(GLsizei)sVar4,uniformIndices,0x8a37,params);
    error = 0x501;
    if ((int)invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      error = 0;
    }
    NegativeTestContext::expectError(ctx,error);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_498);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
  }
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"GL_INVALID_ENUM is generated if pname is not an accepted token.",
             &local_4c1);
  NegativeTestContext::beginSection(ctx,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,dVar2,1,(GLuint *)&numActiveUniforms,0xffffffff,
             local_260 + 1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void get_active_uniformsiv (NegativeTestContext& ctx)
{
	GLuint					shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram		program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint					dummyUniformIndex	= 1;
	GLint					dummyParamDst		= -1;
	GLint					numActiveUniforms	= -1;

	ctx.glUseProgram(program.getProgram());

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_UNIFORMS, &numActiveUniforms);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORMS = " << numActiveUniforms << " (expected 4)." << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveUniformsiv(-1, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveUniformsiv(shader, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program.");
	for (int excess = 0; excess <= 2; excess++)
	{
		std::vector<GLuint> invalidUniformIndices;
		invalidUniformIndices.push_back(1);
		invalidUniformIndices.push_back(numActiveUniforms-1+excess);
		invalidUniformIndices.push_back(1);

		std::vector<GLint> dummyParamsDst(invalidUniformIndices.size());
		ctx.glGetActiveUniformsiv(program.getProgram(), (GLsizei)invalidUniformIndices.size(), &invalidUniformIndices[0], GL_UNIFORM_TYPE, &dummyParamsDst[0]);
		ctx.expectError(excess == 0 ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted token.");
	ctx.glGetActiveUniformsiv(program.getProgram(), 1, &dummyUniformIndex, -1, &dummyParamDst);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}